

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::GlobalObject::GetPropertyQuery
          (GlobalObject *this,Var originalInstance,JavascriptString *propertyNameString,Var *value,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  JavascriptString *originalInstance_00;
  PropertyId propertyId;
  PropertyQueryFlags PVar1;
  ScriptContext *this_00;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *value_local;
  JavascriptString *propertyNameString_local;
  Var originalInstance_local;
  GlobalObject *this_local;
  
  propertyRecord = (PropertyRecord *)requestContext;
  requestContext_local = (ScriptContext *)info;
  info_local = (PropertyValueInfo *)value;
  value_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)originalInstance;
  originalInstance_local = this;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  ScriptContext::GetOrAddPropertyRecord(this_00,(JavascriptString *)value_local,&local_40);
  originalInstance_00 = propertyNameString_local;
  propertyId = PropertyRecord::GetPropertyId(local_40);
  PVar1 = GetPropertyQuery(this,originalInstance_00,propertyId,&info_local->m_instance,
                           (PropertyValueInfo *)requestContext_local,(ScriptContext *)propertyRecord
                          );
  return PVar1;
}

Assistant:

PropertyQueryFlags GlobalObject::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        return GlobalObject::GetPropertyQuery(originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext);
    }